

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strHex.cpp
# Opt level: O3

int jbcoin::charUnHex(uchar c)

{
  if (charUnHex(unsigned_char)::xtab == '\0') {
    charUnHex();
  }
  return charUnHex::xtab.hex[c];
}

Assistant:

int charUnHex (unsigned char c)
{
    struct HexTab
    {
        int hex[256];

        HexTab ()
        {
            std::fill (std::begin (hex), std::end (hex), -1);
            for (int i = 0; i < 10; ++i)
                hex ['0'+i] = i;
            for (int i = 0; i < 6; ++i)
            {
                hex ['A'+i] = 10 + i;
                hex ['a'+i] = 10 + i;
            }
        }
        int operator[] (unsigned char c) const
        {
            return hex[c];
        }
    };

    static HexTab xtab;

    return xtab[c];
}